

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utility.cpp
# Opt level: O3

int FIX::socket_setsockopt(socket_handle s,int opt)

{
  int iVar1;
  undefined1 local_4 [4];
  
  iVar1 = setsockopt(s,(uint)(opt == 1) * 5 + 1,opt,local_4,4);
  return iVar1;
}

Assistant:

int socket_setsockopt(socket_handle s, int opt) {
#ifdef _MSC_VER
  BOOL optval = TRUE;
#else
  int optval = 1;
#endif
  return socket_setsockopt(s, opt, optval);
}